

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_light
          (NodeLoader *this,instance_light__AttributeData *attributeData)

{
  ClassId CVar1;
  reference ppNVar2;
  UniqueId *pUVar3;
  InstanceLightPointerArray *this_00;
  HelperLoaderBase *in_RDI;
  InstanceLight *instanceLight;
  UniqueId instanceLightUniqueId;
  UniqueId instantiatedLightUniqueId;
  Node *currentNode;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)438> **in_stack_ffffffffffffff58;
  UniqueId *in_stack_ffffffffffffff60;
  IFilePartLoader *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  UniqueId local_50;
  UniqueId local_38;
  value_type local_18;
  
  ppNVar2 = std::
            stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
            ::top((stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
                   *)0xc43bbd);
  local_18 = *ppNVar2;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)384>::ID();
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     ((IFilePartLoader *)instantiatedLightUniqueId.mObjectId,
                      (URI *)instantiatedLightUniqueId._0_8_,instanceLightUniqueId.mFileId._4_4_,
                      instanceLightUniqueId.mFileId._3_1_);
  local_38.mFileId = pUVar3->mFileId;
  local_38.mClassId = pUVar3->mClassId;
  local_38._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_38.mObjectId = pUVar3->mObjectId;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  CVar1 = COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)438>::ID();
  IFilePartLoader::createUniqueId
            (in_stack_ffffffffffffff68,(ClassId)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  pUVar3 = (UniqueId *)operator_new(0x58);
  COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)438>::InstanceBase
            ((InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)438> *)
             CONCAT44(CVar1,in_stack_ffffffffffffff70),pUVar3,in_stack_ffffffffffffff60);
  this_00 = COLLADAFW::Node::getInstanceLights(local_18);
  COLLADAFW::ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)438>_*>::
  append((ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)438>_*> *)
         this_00,in_stack_ffffffffffffff58);
  COLLADAFW::UniqueId::~UniqueId(&local_50);
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_light( const instance_light__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedLightUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Light::ID() );

        COLLADAFW::UniqueId instanceLightUniqueId = getHandlingFilePartLoader()->createUniqueId( COLLADAFW::InstanceLight::ID() );
		COLLADAFW::InstanceLight* instanceLight = FW_NEW COLLADAFW::InstanceLight(instanceLightUniqueId, instantiatedLightUniqueId);
		currentNode->getInstanceLights().append(instanceLight);

		return true;
	}